

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MultiFab.cpp
# Opt level: O1

Real __thiscall amrex::MultiFab::norm2(MultiFab *this,int comp,Periodicity *period)

{
  double dVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  Real RVar10;
  unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_> mask;
  MFIter mfi;
  double local_170;
  undefined1 local_160 [80];
  Array4<const_double> local_110;
  Array4<const_double> local_d0;
  MFIter local_90;
  
  OverlapMask((MultiFab *)local_160,(Periodicity *)this);
  local_160._24_8_ = this;
  MFIter::MFIter(&local_90,(FabArrayBase *)this,true);
  local_170 = 0.0;
  if (local_90.currentIndex < local_90.endIndex) {
    local_160._16_8_ = local_160._0_8_;
    local_160._8_8_ = (long)comp << 3;
    local_170 = 0.0;
    do {
      MFIter::tilebox((Box *)(local_160 + 0x34),&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_110,(FabArray<amrex::FArrayBox> *)local_160._24_8_,&local_90);
      FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                (&local_d0,(FabArray<amrex::FArrayBox> *)local_160._16_8_,&local_90);
      lVar2 = (long)(int)local_160._60_4_;
      if ((int)local_160._60_4_ <= (int)local_160._72_4_) {
        lVar3 = (long)(int)local_160._56_4_;
        local_160._40_8_ = local_110.kstride * 8;
        local_160._32_8_ = local_d0.kstride * 8;
        lVar4 = local_110.nstride * local_160._8_8_ +
                (lVar3 - local_110.begin.y) * local_110.jstride * 8 +
                (lVar2 - local_110.begin.z) * local_160._40_8_ + (long)(int)local_160._52_4_ * 8 +
                (long)local_110.begin.x * -8 + (long)local_110.p;
        lVar7 = (lVar3 - local_d0.begin.y) * local_d0.jstride * 8 +
                (lVar2 - local_d0.begin.z) * local_160._32_8_ + (long)(int)local_160._52_4_ * 8 +
                (long)local_d0.begin.x * -8 + (long)local_d0.p;
        do {
          lVar5 = lVar3;
          lVar8 = lVar4;
          lVar9 = lVar7;
          if ((int)local_160._56_4_ <= (int)local_160._68_4_) {
            do {
              if ((int)local_160._52_4_ <= (int)local_160._64_4_) {
                lVar6 = 0;
                do {
                  dVar1 = *(double *)(lVar8 + lVar6 * 8);
                  local_170 = local_170 + (dVar1 * dVar1) / *(double *)(lVar9 + lVar6 * 8);
                  lVar6 = lVar6 + 1;
                } while ((local_160._64_4_ - local_160._52_4_) + 1 != (int)lVar6);
              }
              lVar5 = lVar5 + 1;
              lVar8 = lVar8 + local_110.jstride * 8;
              lVar9 = lVar9 + local_d0.jstride * 8;
            } while (local_160._68_4_ + 1 != (int)lVar5);
          }
          lVar2 = lVar2 + 1;
          lVar4 = lVar4 + local_160._40_8_;
          lVar7 = lVar7 + local_160._32_8_;
        } while (local_160._72_4_ + 1 != (int)lVar2);
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  if (local_170 < 0.0) {
    RVar10 = sqrt(local_170);
  }
  else {
    RVar10 = SQRT(local_170);
  }
  if ((FabArray<amrex::FArrayBox> *)local_160._0_8_ != (FabArray<amrex::FArrayBox> *)0x0) {
    (*((FabArrayBase *)local_160._0_8_)->_vptr_FabArrayBase[1])();
  }
  return RVar10;
}

Assistant:

Real
MultiFab::norm2 (int comp, const Periodicity& period) const
{
    BL_PROFILE("MultiFab::norm2(period)");

    Real nm2 = Real(0.0);

    auto mask = OverlapMask(period);

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion()) {
        auto const& ma = this->const_arrays();
        auto const& maskma = mask->const_arrays();
        nm2 = ParReduce(TypeList<ReduceOpSum>{}, TypeList<Real>{}, *this,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept -> GpuTuple<Real>
        {
            Real tmp = ma[box_no](i,j,k,comp);
            return tmp*tmp/maskma[box_no](i,j,k);
        });
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (!system::regtest_reduction) reduction(+:nm2)
#endif
        for (MFIter mfi(*this,true); mfi.isValid(); ++mfi)
        {
            Box const& bx = mfi.tilebox();
            auto const& a = this->const_array(mfi);
            auto const& m = mask->const_array(mfi);
            AMREX_LOOP_3D(bx, i, j, k,
            {
                Real tmp = a(i,j,k,comp);
                nm2 += tmp*tmp/m(i,j,k);
            });
        }
    }

    ParallelAllReduce::Sum(nm2, ParallelContext::CommunicatorSub());
    return std::sqrt(nm2);
}